

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmEnumPathSegmentsGenerator *gen,cmAppendPathSegmentGenerator *tail,
               cmProjectDirectoryListGenerator *tail_1)

{
  size_type sVar1;
  bool bVar2;
  string path;
  string path_1;
  string local_90;
  string local_70;
  string local_50;
  
  (gen->Current)._M_current =
       (((gen->Names)._M_data)->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  anon_unknown.dwarf_485276::cmEnumPathSegmentsGenerator::GetNextCandidate(&local_90,gen,startPath);
  do {
    sVar1 = local_90._M_string_length;
    if (local_90._M_string_length == 0) {
LAB_0020974a:
      std::__cxx11::string::~string((string *)&local_90);
      return sVar1 != 0;
    }
    tail->NeedReset = false;
    anon_unknown.dwarf_485276::cmDirectoryListGenerator::Reset
              (&tail_1->super_cmDirectoryListGenerator);
    tail->NeedReset = false;
    anon_unknown.dwarf_485276::cmAppendPathSegmentGenerator::GetNextCandidate
              (&local_70,tail,&local_90);
    while (local_70._M_string_length != 0) {
      anon_unknown.dwarf_485276::cmDirectoryListGenerator::Reset
                (&tail_1->super_cmDirectoryListGenerator);
      bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                        (filesCollector,&local_70,tail_1);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_0020974a;
      }
      anon_unknown.dwarf_485276::cmAppendPathSegmentGenerator::GetNextCandidate
                (&local_50,tail,&local_90);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
    anon_unknown.dwarf_485276::cmEnumPathSegmentsGenerator::GetNextCandidate
              (&local_70,gen,startPath);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}